

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

optional<Token> * __thiscall
Analyser::nextToken(optional<Token> *__return_storage_ptr__,Analyser *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  uint64_t uVar4;
  Analyser *this_local;
  
  uVar1 = this->_offset;
  sVar2 = std::vector<Token,_std::allocator<Token>_>::size(&this->_tokens);
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->_tokens,this->_offset);
    uVar4 = Token::GetLine(pvVar3);
    this->_currentLine = (int32_t)uVar4;
    sVar2 = this->_offset;
    this->_offset = sVar2 + 1;
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->_tokens,sVar2);
    std::optional<Token>::optional<Token_&,_true>(__return_storage_ptr__,pvVar3);
  }
  else {
    this->_offset = this->_offset + 1;
    std::optional<Token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Token> Analyser::nextToken() {
	if (_offset >= _tokens.size()) {
		_offset++;
		return {};
	}

	_currentLine = _tokens[_offset].GetLine();
	return _tokens[_offset++];
}